

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O2

void __thiscall
icu_63::GregorianCalendar::GregorianCalendar
          (GregorianCalendar *this,int32_t year,int32_t month,int32_t date,int32_t hour,
          int32_t minute,int32_t second,UErrorCode *status)

{
  TimeZone *zone;
  Locale *aLocale;
  
  zone = TimeZone::createDefault();
  aLocale = Locale::getDefault();
  Calendar::Calendar(&this->super_Calendar,zone,aLocale,status);
  (this->super_Calendar).super_UObject._vptr_UObject =
       (_func_int **)&PTR__GregorianCalendar_003a0e38;
  this->fGregorianCutover = -12219292800000.0;
  this->fCutoverJulianDay = 0x231519;
  this->fNormalizedGregorianCutover = -12219292800000.0;
  this->fGregorianCutoverYear = 0x62e;
  this->fIsGregorian = '\x01';
  this->fInvertGregorian = '\0';
  Calendar::set(&this->super_Calendar,UCAL_ERA,1);
  Calendar::set(&this->super_Calendar,UCAL_YEAR,year);
  Calendar::set(&this->super_Calendar,UCAL_MONTH,month);
  Calendar::set(&this->super_Calendar,UCAL_DATE,date);
  Calendar::set(&this->super_Calendar,UCAL_HOUR_OF_DAY,hour);
  Calendar::set(&this->super_Calendar,UCAL_MINUTE,minute);
  Calendar::set(&this->super_Calendar,UCAL_SECOND,second);
  return;
}

Assistant:

GregorianCalendar::GregorianCalendar(int32_t year, int32_t month, int32_t date,
                                     int32_t hour, int32_t minute, int32_t second,
                                     UErrorCode& status)
                                     :   Calendar(TimeZone::createDefault(), Locale::getDefault(), status),
                                     fGregorianCutover(kPapalCutover),
                                     fCutoverJulianDay(kCutoverJulianDay), fNormalizedGregorianCutover(fGregorianCutover), fGregorianCutoverYear(1582),
                                     fIsGregorian(TRUE), fInvertGregorian(FALSE)
{
    set(UCAL_ERA, AD);
    set(UCAL_YEAR, year);
    set(UCAL_MONTH, month);
    set(UCAL_DATE, date);
    set(UCAL_HOUR_OF_DAY, hour);
    set(UCAL_MINUTE, minute);
    set(UCAL_SECOND, second);
}